

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::IsEndOfAlternative
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this)

{
  EncodedChar EVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  EncodedChar *pEVar5;
  
  pEVar5 = this->next;
  if (this->inputLim < pEVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pEVar5 = this->next;
  }
  EVar1 = *pEVar5;
  bVar3 = true;
  if (((EVar1 != L'|') && (EVar1 != L')')) && ((EVar1 != L'\0' || (pEVar5 < this->inputLim)))) {
    bVar3 = EVar1 == L'/';
  }
  return bVar3;
}

Assistant:

inline bool Parser<P, IsLiteral>::IsEndOfAlternative()
    {
        EncodedChar ec = ECLookahead();
        // Could be terminating 0, but embedded 0 is part of alternative
        return (ec == 0 && IsEOF()) || ec == ')' || ec == '|' || (IsLiteral && ec == '/');
    }